

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

void open_files(void)

{
  create_file_names();
  action_file = (FILE *)fopen(action_file_name,"w");
  if ((FILE *)action_file == (FILE *)0x0) {
    open_error(action_file_name);
  }
  text_file = (FILE *)fopen(text_file_name,"w");
  if ((FILE *)text_file == (FILE *)0x0) {
    open_error(text_file_name);
  }
  if (vflag != '\0') {
    verbose_file = (FILE *)fopen(verbose_file_name,"w");
    if ((FILE *)verbose_file == (FILE *)0x0) {
      open_error(verbose_file_name);
    }
  }
  if (ebnfflag != '\0') {
    ebnf_file = (FILE *)fopen(ebnf_file_name,"w");
    if ((FILE *)ebnf_file == (FILE *)0x0) {
      open_error(ebnf_file_name);
    }
  }
  if (dflag != '\0') {
    defines_file = (FILE *)fopen(defines_file_name,"w");
    if ((FILE *)defines_file == (FILE *)0x0) {
      open_error(defines_file_name);
    }
    union_file = (FILE *)fopen(union_file_name,"w");
    if ((FILE *)union_file == (FILE *)0x0) {
      open_error(union_file_name);
    }
  }
  output_file = (FILE *)fopen(output_file_name,"w");
  if ((FILE *)output_file == (FILE *)0x0) {
    open_error(output_file_name);
  }
  if (rflag == '\0') {
    code_file = output_file;
  }
  else {
    code_file = (FILE *)fopen(code_file_name,"w");
    if ((FILE *)code_file == (FILE *)0x0) {
      open_error(code_file_name);
      return;
    }
  }
  return;
}

Assistant:

void open_files()
{
    create_file_names();

    action_file = fopen(action_file_name, "w");
    if (action_file == 0)
	open_error(action_file_name);

    text_file = fopen(text_file_name, "w");
    if (text_file == 0)
	open_error(text_file_name);

    if (vflag)
    {
	verbose_file = fopen(verbose_file_name, "w");
	if (verbose_file == 0)
	    open_error(verbose_file_name);
    }

    if (ebnfflag)
    {
	ebnf_file = fopen(ebnf_file_name, "w");
	if (ebnf_file == 0)
	    open_error(ebnf_file_name);
    }

    if (dflag)
    {
	defines_file = fopen(defines_file_name, "w");
	if (defines_file == 0)
	    open_error(defines_file_name);
	union_file = fopen(union_file_name, "w");
	if (union_file ==  0)
	    open_error(union_file_name);
    }

    output_file = fopen(output_file_name, "w");
    if (output_file == 0)
	open_error(output_file_name);

    if (rflag)
    {
	code_file = fopen(code_file_name, "w");
	if (code_file == 0)
	    open_error(code_file_name);
    }
    else
	code_file = output_file;
}